

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O2

bool __thiscall Clasp::SatElite::doPreprocess(SatElite *this)

{
  uint32 uVar1;
  bool bVar2;
  uint uVar3;
  time_t tVar4;
  Options *pOVar5;
  long lVar6;
  uint32 clauseId;
  bool bVar7;
  
  uVar1 = (this->super_SatPreprocessor).clauses_.ebo_.size;
  for (clauseId = 0; uVar1 != clauseId; clauseId = clauseId + 1) {
    attach(this,clauseId,true);
  }
  pOVar5 = (this->super_SatPreprocessor).opts_;
  if (((ulong)*pOVar5 & 0x1ffe000) == 0) {
    lVar6 = 0x7fffffffffffffff;
  }
  else {
    tVar4 = time((time_t *)0x0);
    pOVar5 = (this->super_SatPreprocessor).opts_;
    lVar6 = (ulong)(*(uint *)pOVar5 >> 0xd & 0xfff) + tVar4;
  }
  this->timeout_ = lVar6;
  uVar3 = *(uint *)pOVar5 >> 2 & 0x7ff;
  uVar3 = -(uint)(uVar3 == 0) | uVar3;
  while ((ulong)(this->elimHeap_).heap_.ebo_.size + (ulong)(this->queue_).ebo_.size != 0) {
    bVar2 = backwardSubsume(this);
    if (!bVar2) {
      return false;
    }
    bVar2 = timeout(this);
    bVar7 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if ((bVar2) || (bVar7)) break;
    bVar2 = eliminateVars(this);
    if (!bVar2) {
      return false;
    }
  }
  reportProgress(this,event_algorithm,100,100);
  return true;
}

Assistant:

bool SatElite::doPreprocess() {
	// 1. add clauses to occur lists
	for (uint32 i  = 0, end = numClauses(); i != end; ++i) {
		attach(i, true);
	}
	// 2. remove subsumed clauses, eliminate vars by clause distribution
	timeout_ = opts_->limTime ? time(0) + opts_->limTime : std::numeric_limits<std::time_t>::max();
	for (uint32 i = 0, end = opts_->limIters ? opts_->limIters : UINT32_MAX; queue_.size()+elimHeap_.size() > 0; ++i) {
		if (!backwardSubsume())   { return false; }
		if (timeout() || i == end){ break;        }
		if (!eliminateVars())     { return false; }
	}
	reportProgress(Progress::event_algorithm, 100,100);
	return true;
}